

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O0

void __thiscall
t_cl_generator::generate_cl_struct
          (t_cl_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  void *this_00;
  char *pcVar4;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  undefined1 local_48 [8];
  string name;
  bool is_exception_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cl_generator *this_local;
  
  name.field_2._M_local_buf[0xf] = is_exception;
  type_name_abi_cxx11_((string *)local_48,this,&tstruct->super_t_type);
  pcVar4 = "(thrift:def-struct ";
  if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar4 = "(thrift:def-exception ";
  }
  poVar2 = std::operator<<(out,pcVar4);
  std::__cxx11::string::string((string *)&local_98,(string *)local_48);
  prefix(&local_78,this,&local_98);
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_up((t_generator *)this);
  bVar1 = t_doc::has_doc((t_doc *)tstruct);
  if (bVar1) {
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    std::operator<<(out,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    poVar2 = std::operator<<(out,"\"");
    psVar3 = t_doc::get_doc_abi_cxx11_((t_doc *)tstruct);
    std::__cxx11::string::string((string *)&local_f8,(string *)psVar3);
    cl_docstring(&local_d8,this,&local_f8);
    poVar2 = std::operator<<(poVar2,(string *)&local_d8);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  std::operator<<(out,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  generate_cl_struct_internal(this,out,tstruct,(bool)(name.field_2._M_local_buf[0xf] & 1));
  t_generator::indent_down((t_generator *)this);
  poVar2 = std::operator<<(out,")");
  this_00 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_cl_generator::generate_cl_struct(std::ostream& out, t_struct* tstruct, bool is_exception = false) {
  std::string name = type_name(tstruct);
  out << (is_exception ? "(thrift:def-exception " : "(thrift:def-struct ") <<
      prefix(name) << endl;
  indent_up();
  if ( tstruct->has_doc() ) {
    out << indent() ;
    out << "\"" << cl_docstring(tstruct->get_doc()) << "\"" << endl;
  }
  out << indent() ;
  generate_cl_struct_internal(out, tstruct, is_exception);
  indent_down();
  out << ")" << endl << endl;
}